

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_bool nk_button_image_text_styled
                  (nk_context *ctx,nk_style_button *style,nk_image img,char *text,int len,
                  nk_flags align)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  nk_widget_layout_states nVar3;
  nk_context *in;
  nk_rect bounds;
  nk_rect local_40;
  
  nVar3 = NK_WIDGET_INVALID;
  if (((ctx != (nk_context *)0x0) &&
      (pnVar1 = ctx->current, nVar3 = NK_WIDGET_INVALID, pnVar1 != (nk_window *)0x0)) &&
     (pnVar2 = pnVar1->layout, pnVar2 != (nk_panel *)0x0)) {
    nVar3 = nk_widget(&local_40,ctx);
    if (nVar3 != NK_WIDGET_INVALID) {
      if (nVar3 == NK_WIDGET_ROM) {
        in = (nk_context *)0x0;
      }
      else {
        in = (nk_context *)0x0;
        if ((pnVar2->flags & 0x1000) == 0) {
          in = ctx;
        }
      }
      nVar3 = nk_do_button_text_image
                        (&ctx->last_widget_state,&pnVar1->buffer,local_40,img,text,len,align,
                         ctx->button_behavior,style,(ctx->style).font,&in->input);
    }
  }
  return nVar3;
}

Assistant:

NK_API nk_bool
nk_button_image_text_styled(struct nk_context *ctx,
const struct nk_style_button *style, struct nk_image img, const char *text,
int len, nk_flags align)
{
struct nk_window *win;
struct nk_panel *layout;
const struct nk_input *in;

struct nk_rect bounds;
enum nk_widget_layout_states state;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
layout = win->layout;

state = nk_widget(&bounds, ctx);
if (!state) return 0;
in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
return nk_do_button_text_image(&ctx->last_widget_state, &win->buffer,
bounds, img, text, len, align, ctx->button_behavior,
style, ctx->style.font, in);
}